

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::getPrimalRay(SoPlexBase<double> *this,VectorBase<double> *vector)

{
  bool bVar1;
  
  if ((((this->_hasSolReal == true) && (((this->_solReal).field_0x98 & 2) != 0)) ||
      ((this->_hasSolRational == true && (((this->_solRational).field_0xd0 & 2) != 0)))) &&
     ((this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <=
      (int)((ulong)((long)(vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3))) {
    if ((this->_hasSolReal == false) && (this->_hasSolRational != false)) {
      SolBase<double>::operator=(&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    bVar1 = true;
    if (((this->_solReal).field_0x98 & 2) != 0) {
      VectorBase<double>::operator=(vector,&(this->_solReal)._primalRay);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getPrimalRay(VectorBase<R>& vector)
{
   if(hasPrimalRay() && vector.dim() >= numCols())
   {
      _syncRealSolution();
      _solReal.getPrimalRaySol(vector);
      return true;
   }
   else
      return false;

}